

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::syntax::UdpEntrySyntax*>::emplace_back<slang::syntax::UdpEntrySyntax*>
          (SmallVectorBase<slang::syntax::UdpEntrySyntax*> *this,UdpEntrySyntax **args)

{
  long lVar1;
  reference ppUVar2;
  pointer ppUVar3;
  
  lVar1 = *(long *)(this + 8);
  ppUVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppUVar3 = emplaceRealloc<slang::syntax::UdpEntrySyntax*>(this,ppUVar3,args);
    return ppUVar3;
  }
  *ppUVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppUVar2 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::back
                      ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this);
  return ppUVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }